

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall DirectiveObjImport::DirectiveObjImport(DirectiveObjImport *this,path *inputName)

{
  ElfRelocator *this_00;
  int iVar1;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveObjImport_001c11a8;
  this_00 = &this->rel;
  ByteArray::ByteArray(&this_00->outputData);
  (this->rel).ctors.super__Vector_base<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rel).ctors.super__Vector_base<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rel).ctors.super__Vector_base<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rel).files.super__Vector_base<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rel).files.super__Vector_base<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rel).relocator._M_t.
  super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>._M_t.
  super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>.
  super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl = (IElfRelocator *)0x0;
  (this->rel).files.super__Vector_base<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ctor)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  iVar1 = ElfRelocator::init(this_00,(EVP_PKEY_CTX *)inputName);
  (this->super_CAssemblerCommand).field_0x14 = (char)iVar1;
  if ((char)iVar1 != '\0') {
    ElfRelocator::exportSymbols(this_00);
  }
  return;
}

Assistant:

DirectiveObjImport::DirectiveObjImport(const fs::path& inputName)
{
	ctor = nullptr;
	success = rel.init(inputName);
	if (success)
		rel.exportSymbols();
}